

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O1

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
set(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this,base_iterator p)

{
  mapping_type *pmVar1;
  element_type *peVar2;
  pointer pbVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  _List_node_base *p_Var7;
  pointer pbVar8;
  difference_type __d_1;
  ulong uVar9;
  difference_type __d;
  ulong uVar10;
  pointer pbVar11;
  rule_type *prVar12;
  
  pmVar1 = this->map_;
  uVar5 = 0;
  for (p_Var7 = (pmVar1->begin_)._M_node; p_Var7 != p._M_node; p_Var7 = p_Var7->_M_next) {
    uVar5 = uVar5 + 1;
  }
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pbVar8 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)pbVar3 - (long)pbVar8 >> 4;
  pbVar11 = pbVar8;
  uVar10 = uVar9;
  while (uVar4 = uVar10, 0 < (long)uVar4) {
    uVar10 = uVar4 >> 1;
    if (pbVar11[uVar10].offset < uVar5) {
      pbVar11 = pbVar11 + uVar10 + 1;
      uVar10 = ~uVar10 + uVar4;
    }
  }
  uVar10 = uVar9 - 1;
  if (pbVar11 != pbVar3) {
    uVar10 = (long)pbVar11 - (long)pbVar8 >> 4;
  }
  this->current_ = uVar10;
  if ((uVar10 != 0) && (uVar10 + 1 < uVar9)) {
    prVar12 = &pbVar8[uVar10].rule;
    uVar4 = uVar10 + 1;
    while (uVar10 = uVar4, (*prVar12 & this->mask_) == 0) {
      this->current_ = uVar10;
      if ((uVar10 == 0) || (prVar12 = prVar12 + 4, uVar4 = uVar10 + 1, uVar9 <= uVar10 + 1))
      goto LAB_0012420e;
    }
    uVar10 = uVar10 - 1;
  }
LAB_0012420e:
  pbVar8 = pbVar8 + uVar10;
  if (uVar9 == uVar10) {
    pbVar8 = pbVar3 + -1;
  }
  uVar9 = pbVar8->offset;
  if (uVar9 == uVar5 || (long)(uVar9 - uVar5) < 0) {
    if (uVar9 != uVar5) {
      lVar6 = uVar5 - uVar9;
      do {
        p._M_node = (p._M_node)->_M_prev;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  else {
    lVar6 = uVar5 - uVar9;
    do {
      p._M_node = (p._M_node)->_M_next;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
  }
  (this->value_).iterator_._M_node = p._M_node;
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar6 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (uVar10 != (long)(peVar2->
                      super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                      )._M_impl.super__Vector_impl_data._M_finish - lVar6 >> 4) {
    (this->value_).rule_ = *(rule_type *)(lVar6 + 8 + uVar10 * 0x10);
  }
  return;
}

Assistant:

void set(base_iterator p)
                    {
                        size_t dist =  std::distance(map_->begin(),p);

                        index_type::const_iterator b=index().begin();
                        index_type::const_iterator e=index().end();
                        index_type::const_iterator ptr = std::lower_bound(b,e,break_info(dist));

                        if(ptr==index().end())
                            current_=size()-1;
                        else
                            current_=ptr - index().begin();

                        while(!valid_offset(current_))
                            current_ ++;

                        std::ptrdiff_t diff = get_offset(current_) - dist;
                        std::advance(p,diff);
                        value_.iterator(p);
                        update_rule();
                    }